

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O3

void __thiscall QTabWidget::setTabVisible(QTabWidget *this,int index,bool visible)

{
  long lVar1;
  QTabBar *this_00;
  bool bVar2;
  int index_00;
  QWidget *pQVar3;
  undefined7 in_register_00000011;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  pQVar3 = QStackedWidget::widget(*(QStackedWidget **)(lVar1 + 0x260),index);
  this_00 = *(QTabBar **)(lVar1 + 600);
  index_00 = QTabBar::currentIndex(this_00);
  bVar2 = QTabBar::isTabVisible(this_00,index_00);
  QTabBar::setTabVisible(*(QTabBar **)(lVar1 + 600),index,visible);
  if ((int)CONCAT71(in_register_00000011,visible) != 0) {
    if (bVar2) goto LAB_004aa91b;
    QTabBar::setCurrentIndex(*(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600),index);
  }
  if (pQVar3 != (QWidget *)0x0) {
    (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3);
  }
LAB_004aa91b:
  setUpLayout(this,false);
  return;
}

Assistant:

void QTabWidget::setTabVisible(int index, bool visible)
{
    Q_D(QTabWidget);
    QWidget *widget = d->stack->widget(index);
    bool currentVisible = d->tabs->isTabVisible(d->tabs->currentIndex());
    d->tabs->setTabVisible(index, visible);
    if (!visible) {
        if (widget)
            widget->setVisible(false);
    } else if (!currentVisible) {
        setCurrentIndex(index);
        if (widget)
            widget->setVisible(true);
    }
    setUpLayout();
}